

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

wchar_t tty_rawmode(EditLine *el)

{
  termios *t;
  termios *td;
  termios *ptVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  wchar_t wVar5;
  speed_t sVar6;
  speed_t sVar7;
  tcflag_t *ptVar8;
  tcflag_t *ptVar9;
  tcflag_t *ptVar10;
  wchar_t wVar11;
  uint *puVar12;
  long lVar13;
  
  if ((byte)((el->el_tty).t_mode - 1) < 2) {
    return L'\0';
  }
  if ((el->el_flags & L'\x04') != L'\0') {
    return L'\0';
  }
  t = &(el->el_tty).t_ts;
  wVar5 = tty_getty(el,t);
  if (wVar5 == L'\xffffffff') {
    return L'\xffffffff';
  }
  (el->el_tty).t_eight = (uint)((~(el->el_tty).t_ts.c_cflag & 0x30) == 0);
  sVar6 = tty__getspeed(t);
  (el->el_tty).t_speed = sVar6;
  td = &(el->el_tty).t_ex;
  sVar7 = tty__getspeed(td);
  sVar6 = (el->el_tty).t_speed;
  if (sVar7 == sVar6) {
    sVar7 = tty__getspeed(&(el->el_tty).t_ed);
    sVar6 = (el->el_tty).t_speed;
    if (sVar7 == sVar6) goto LAB_00112090;
  }
  cfsetispeed((termios *)td,sVar6);
  cfsetospeed((termios *)td,(el->el_tty).t_speed);
  ptVar1 = &(el->el_tty).t_ed;
  cfsetispeed((termios *)ptVar1,(el->el_tty).t_speed);
  cfsetospeed((termios *)ptVar1,(el->el_tty).t_speed);
LAB_00112090:
  if (((el->el_tty).t_ts.c_lflag & 2) != 0) {
    ptVar1 = &(el->el_tty).t_ed;
    puVar12 = &(el->el_tty).t_t[1][0].t_clrmask;
    for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
      wVar5 = (wchar_t)lVar13;
      ptVar8 = tty__get_flag(t,wVar5);
      ptVar9 = tty__get_flag(ptVar1,wVar5);
      ptVar10 = tty__get_flag(td,wVar5);
      uVar3 = *ptVar8;
      if ((uVar3 != *ptVar10) && ((lVar13 != 2 || (uVar3 != *ptVar9)))) {
        *ptVar9 = uVar3 & ~*puVar12 | puVar12[-1];
        *ptVar10 = ~puVar12[-0x14] & *ptVar8 | puVar12[-0x15];
      }
      puVar12 = puVar12 + 4;
    }
    wVar5 = L'\0';
    if ((~(el->el_tty).t_ex.c_oflag & 0x1800) != 0) {
      wVar5 = (uint)(el->el_terminal).t_flags >> 3 & 1;
    }
    (el->el_tty).t_tabs = wVar5;
    tty__getchar(t,(el->el_tty).t_c[2]);
    lVar13 = 0x1c0;
    do {
      if (lVar13 == 0x1d9) goto LAB_001121d5;
      lVar4 = lVar13 + 2;
      pcVar2 = (char *)((long)&el->el_prog + lVar13);
      lVar13 = lVar13 + 1;
    } while (*(char *)((long)&(el->el_cursor).h + lVar4) == *pcVar2);
    for (wVar5 = L'\0'; wVar5 != L'\x19'; wVar5 = wVar5 + L'\x01') {
      tty_update_char(el,L'\x01',wVar5);
    }
    tty_bind_char(el,L'\0');
    tty__setchar(ptVar1,(el->el_tty).t_c[1]);
    for (wVar5 = L'\0'; wVar5 != L'\x19'; wVar5 = wVar5 + L'\x01') {
      tty_update_char(el,L'\0',wVar5);
    }
    tty__setchar(td,(el->el_tty).t_c[0]);
  }
LAB_001121d5:
  wVar11 = L'\xffffffff';
  wVar5 = tty_setty(el,L'\x01',&(el->el_tty).t_ed);
  if (wVar5 != L'\xffffffff') {
    (el->el_tty).t_mode = '\x01';
    wVar11 = L'\0';
  }
  return wVar11;
}

Assistant:

libedit_private int
tty_rawmode(EditLine *el)
{

	if (el->el_tty.t_mode == ED_IO || el->el_tty.t_mode == QU_IO)
		return 0;

	if (el->el_flags & EDIT_DISABLED)
		return 0;

	if (tty_getty(el, &el->el_tty.t_ts) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_getty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	/*
         * We always keep up with the eight bit setting and the speed of the
         * tty. But we only believe changes that are made to cooked mode!
         */
	el->el_tty.t_eight = tty__geteightbit(&el->el_tty.t_ts);
	el->el_tty.t_speed = tty__getspeed(&el->el_tty.t_ts);

	if (tty__getspeed(&el->el_tty.t_ex) != el->el_tty.t_speed ||
	    tty__getspeed(&el->el_tty.t_ed) != el->el_tty.t_speed) {
		(void) cfsetispeed(&el->el_tty.t_ex, el->el_tty.t_speed);
		(void) cfsetospeed(&el->el_tty.t_ex, el->el_tty.t_speed);
		(void) cfsetispeed(&el->el_tty.t_ed, el->el_tty.t_speed);
		(void) cfsetospeed(&el->el_tty.t_ed, el->el_tty.t_speed);
	}
	if (tty__cooked_mode(&el->el_tty.t_ts)) {
		int i;

		for (i = MD_INP; i <= MD_LIN; i++)
			tty_update_flags(el, i);

		if (tty__gettabs(&el->el_tty.t_ex) == 0)
			el->el_tty.t_tabs = 0;
		else
			el->el_tty.t_tabs = EL_CAN_TAB ? 1 : 0;

		tty__getchar(&el->el_tty.t_ts, el->el_tty.t_c[TS_IO]);
		/*
		 * Check if the user made any changes.
		 * If he did, then propagate the changes to the
		 * edit and execute data structures.
		 */
		for (i = 0; i < C_NCC; i++)
			if (el->el_tty.t_c[TS_IO][i] !=
			    el->el_tty.t_c[EX_IO][i])
				break;

		if (i != C_NCC) {
			/*
			 * Propagate changes only to the unlibedit_private
			 * chars that have been modified just now.
			 */
			for (i = 0; i < C_NCC; i++)
				tty_update_char(el, ED_IO, i);

			tty_bind_char(el, 0);
			tty__setchar(&el->el_tty.t_ed, el->el_tty.t_c[ED_IO]);

			for (i = 0; i < C_NCC; i++)
				tty_update_char(el, EX_IO, i);

			tty__setchar(&el->el_tty.t_ex, el->el_tty.t_c[EX_IO]);
		}
	}
	if (tty_setty(el, TCSADRAIN, &el->el_tty.t_ed) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	el->el_tty.t_mode = ED_IO;
	return 0;
}